

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Trace(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  bool bVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  uint fVerbose;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  fVerbose = 0;
  while( true ) {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"lvh"), iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x6c) {
      iVar2 = -2;
      Abc_Print(-2,"usage: &trace [-lvh]\n");
      Abc_Print(-2,"\t           performs delay trace of LUT-mapped network\n");
      pcVar4 = "lib";
      if (!bVar1) {
        pcVar4 = "unit";
      }
      Abc_Print(-2,"\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n",
                pcVar4);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar4);
      pcVar4 = "\t-h       : print the command usage\n";
LAB_002161a0:
      Abc_Print(iVar2,pcVar4);
      return 1;
    }
    bVar1 = (bool)(bVar1 ^ 1);
  }
  p = pAbc->pGia;
  if (p == (Gia_Man_t *)0x0) {
    pcVar4 = "Abc_CommandAbc9Speedup(): There is no AIG to map.\n";
  }
  else {
    if (p->vMapping != (Vec_Int_t *)0x0) {
      if (bVar1) {
        pvVar3 = pAbc->pLibLut;
      }
      else {
        pvVar3 = (void *)0x0;
      }
      p->pLutLib = pvVar3;
      Gia_ManDelayTraceLutPrint(p,fVerbose);
      return 0;
    }
    pcVar4 = "Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n";
  }
  iVar2 = -1;
  goto LAB_002161a0;
}

Assistant:

int Abc_CommandAbc9Trace( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    int fUseLutLib;
    int fVerbose;
    // set defaults
    fUseLutLib = 0;
    fVerbose   = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "lvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'l':
            fUseLutLib ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): There is no AIG to map.\n" );
        return 1;
    }
    if ( !Gia_ManHasMapping(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Speedup(): Mapping of the AIG is not defined.\n" );
        return 1;
    }
    pAbc->pGia->pLutLib = fUseLutLib ? pAbc->pLibLut : NULL;
    Gia_ManDelayTraceLutPrint( pAbc->pGia, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &trace [-lvh]\n" );
    Abc_Print( -2, "\t           performs delay trace of LUT-mapped network\n" );
    Abc_Print( -2, "\t-l       : toggle using unit- or LUT-library-delay model [default = %s]\n", fUseLutLib? "lib": "unit" );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}